

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

local_time_format_info * __thiscall
toml::basic_value<toml::type_config>::as_local_time_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == local_time) {
    return (local_time_format_info *)((long)&this->field_1 + 0x10);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_local_time_fmt()",&local_31);
  throw_bad_cast(this,&local_30,local_time);
}

Assistant:

local_time_format_info const& as_local_time_fmt() const
    {
        if(this->type_ != value_t::local_time)
        {
            this->throw_bad_cast("toml::value::as_local_time_fmt()", value_t::local_time);
        }
        return this->local_time_.format;
    }